

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *includes,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  bool bVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalGenerator *pcVar3;
  pointer pcVar4;
  cmCompiledGeneratorExpression *pcVar5;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *this;
  PolicyStatus PVar6;
  char *pcVar7;
  ostream *poVar8;
  long *plVar9;
  cmake *this_00;
  size_type *psVar10;
  long *plVar11;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar12;
  char cVar13;
  pointer path;
  bool bVar14;
  string usedIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  string inc;
  string local_2a8;
  cmGeneratorTarget *local_288;
  cmLinkImplItem *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 *local_258;
  long local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  pointer local_220;
  PolicyMap *local_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  pointer local_1d0;
  cmGeneratorExpressionDAGChecker *local_1c8;
  string *local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b8;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *local_1b0;
  undefined1 local_1a8 [32];
  long local_188;
  cmState *local_180;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_178;
  PositionType local_170;
  ios_base local_138 [264];
  
  local_220 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_220 != local_1d0) {
    local_218 = &tgt->PolicyMap;
    local_288 = tgt;
    local_1c8 = dagChecker;
    local_1c0 = config;
    local_1b8 = includes;
    local_1b0 = &uniqueIncludes->_M_ht;
    do {
      local_280 = (*local_220)->LinkImplItem;
      pcVar2 = (local_280->super_cmLinkItem).Target;
      if (pcVar2 == (cmGeneratorTarget *)0x0) {
        cVar13 = '\0';
      }
      else {
        cVar13 = pcVar2->Target->IsImportedTarget;
      }
      bVar1 = local_280->FromGenex;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar7 = cmCompiledGeneratorExpression::Evaluate
                         (((*local_220)->ge).x_,local_288->LocalGenerator,local_1c0,false,local_288,
                          local_1c8,language);
      std::__cxx11::string::string((string *)local_1a8,pcVar7,(allocator *)&local_258);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&local_238,false);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      local_258 = &local_248;
      local_250 = 0;
      local_248 = 0;
      path = local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        bVar14 = path == local_238.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar14) break;
        if ((cVar13 != '\0') &&
           (bVar14 = cmsys::SystemTools::FileExists((path->_M_dataplus)._M_p), !bVar14)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          MVar12 = FATAL_ERROR;
          if (bVar1 != false) {
            PVar6 = cmPolicies::PolicyMap::Get(local_218,CMP0027);
            if (PVar6 != OLD) {
              if (PVar6 != WARN) goto LAB_003360b2;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)0x1b,id_00);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,
                                  local_2a8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
            }
            MVar12 = AUTHOR_WARNING;
          }
LAB_003360b2:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Imported target \"",0x11);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,
                              (local_280->super_cmLinkItem).super_string._M_dataplus._M_p,
                              (local_280->super_cmLinkItem).super_string._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" includes non-existent path\n  \"",0x20);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                     ,0x114);
          pcVar3 = local_288->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar3,MVar12,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
LAB_0033615f:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if (local_258 != &local_248) {
            operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_238);
          return;
        }
        bVar14 = cmsys::SystemTools::FileIsFullPath((path->_M_dataplus)._M_p);
        if (!bVar14) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          if ((local_280->super_cmLinkItem).super_string._M_string_length == 0) {
            PVar6 = cmPolicies::PolicyMap::Get(local_218,CMP0021);
            MVar12 = FATAL_ERROR;
            if (PVar6 == OLD) {
              bVar14 = true;
            }
            else if (PVar6 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)0x15,id);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,
                                  local_2a8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
              bVar14 = false;
              MVar12 = AUTHOR_WARNING;
            }
            else {
              bVar14 = false;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Found relative path while evaluating include directories of \"",0x3d);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(local_288->Target->Name)._M_dataplus._M_p,
                                (local_288->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\":\n  \"",6);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,
                                (local_280->super_cmLinkItem).super_string._M_dataplus._M_p,
                                (local_280->super_cmLinkItem).super_string._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",0x42)
            ;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            MVar12 = FATAL_ERROR;
            bVar14 = false;
          }
          if (!bVar14) {
            pcVar3 = local_288->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar3,MVar12,&local_2a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1
                             );
            }
            if (MVar12 == FATAL_ERROR) goto LAB_0033615f;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        bVar14 = cmSystemTools::IsOff((path->_M_dataplus)._M_p);
        if (!bVar14) {
          cmsys::SystemTools::ConvertToUnixSlashes(path);
        }
        pcVar4 = (path->_M_dataplus)._M_p;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar4,pcVar4 + path->_M_string_length);
        this = local_1b0;
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::resize(local_1b0,local_1b0->_M_num_elements + 1);
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert_unique_noresize
                  ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)&local_2a8,this,(value_type *)local_1a8);
        if ((local_2a8.field_2._M_local_buf[0] == '\x01') &&
           (std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_1b8,(value_type *)local_1a8), debugIncludes)) {
          std::operator+(&local_278," * ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_278);
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_2a8.field_2._M_allocated_capacity = *psVar10;
            local_2a8.field_2._8_8_ = plVar9[3];
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *psVar10;
            local_2a8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2a8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_2a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        path = path + 1;
      }
      if (local_250 != 0) {
        this_00 = cmLocalGenerator::GetCMakeInstance(local_288->LocalGenerator);
        local_1f0[0] = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"Used includes for target ","");
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1f0,
                                    (ulong)(local_288->Target->Name)._M_dataplus._M_p);
        local_210 = &local_200;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_200 = *plVar11;
          lStack_1f8 = plVar9[3];
        }
        else {
          local_200 = *plVar11;
          local_210 = (long *)*plVar9;
        }
        local_208 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        psVar10 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_278.field_2._M_allocated_capacity = *psVar10;
          local_278.field_2._8_8_ = plVar9[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar10;
          local_278._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_278._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        psVar10 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_2a8.field_2._M_allocated_capacity = *psVar10;
          local_2a8.field_2._8_8_ = plVar9[3];
        }
        else {
          local_2a8.field_2._M_allocated_capacity = *psVar10;
          local_2a8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_2a8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pcVar5 = ((*local_220)->ge).x_;
        pcVar4 = (pcVar5->Backtrace).Context.Name._M_dataplus._M_p;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar4,
                   pcVar4 + (pcVar5->Backtrace).Context.Name._M_string_length);
        local_188 = (pcVar5->Backtrace).Context.Line;
        local_170 = (pcVar5->Backtrace).Snapshot.Position.Position;
        local_180 = (pcVar5->Backtrace).Snapshot.State;
        pcStack_178 = (pcVar5->Backtrace).Snapshot.Position.Tree;
        cmake::IssueMessage(this_00,LOG,&local_2a8,(cmListFileBacktrace *)local_1a8,false);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210,local_200 + 1);
        }
        if (local_1f0[0] != local_1e0) {
          operator_delete(local_1f0[0],local_1e0[0] + 1);
        }
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_238);
      local_220 = local_220 + 1;
    } while (bVar14 && local_220 != local_1d0);
  }
  return;
}

Assistant:

static void processIncludeDirectories(cmGeneratorTarget const* tgt,
      const std::vector<cmGeneratorTarget::TargetPropertyEntry*> &entries,
      std::vector<std::string> &includes,
      UNORDERED_SET<std::string> &uniqueIncludes,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugIncludes,
      const std::string& language)
{
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(
                                        tgt->GetLocalGenerator(),
                                              config,
                                              false,
                                              tgt,
                                              dagChecker, language),
                                    entryIncludes);

    std::string usedIncludes;
    for(std::vector<std::string>::iterator
          li = entryIncludes.begin(); li != entryIncludes.end(); ++li)
      {
      if (fromImported
          && !cmSystemTools::FileExists(li->c_str()))
        {
        std::ostringstream e;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (checkCMP0027)
          {
          switch(tgt->GetPolicyStatusCMP0027())
            {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
            case cmPolicies::OLD:
              messageType = cmake::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << *li << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
        }

      if (!cmSystemTools::FileIsFullPath(li->c_str()))
        {
        std::ostringstream e;
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (!targetName.empty())
          {
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << *li << "\"";
          }
        else
          {
          switch(tgt->GetPolicyStatusCMP0021())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }
          e << "Found relative path while evaluating include directories of "
          "\"" << tgt->GetName() << "\":\n  \"" << *li << "\"\n";
          }
        if (!noMessage)
          {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == cmake::FATAL_ERROR)
            {
            return;
            }
          }
        }

      if (!cmSystemTools::IsOff(li->c_str()))
        {
        cmSystemTools::ConvertToUnixSlashes(*li);
        }
      std::string inc = *li;

      if(uniqueIncludes.insert(inc).second)
        {
        includes.push_back(inc);
        if (debugIncludes)
          {
          usedIncludes += " * " + inc + "\n";
          }
        }
      }
    if (!usedIncludes.empty())
      {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used includes for target ")
                            + tgt->GetName() + ":\n"
                            + usedIncludes, (*it)->ge->GetBacktrace());
      }
    }
}